

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# recompose.hpp
# Opt level: O0

void __thiscall
MGARD::Recomposer<float>::recompose
          (Recomposer<float> *this,float *data_,
          vector<unsigned_long,_std::allocator<unsigned_long>_> *dims,size_t target_level,
          bool hierarchical,vector<unsigned_long,_std::allocator<unsigned_long>_> *strides)

{
  bool bVar1;
  const_iterator this_00;
  size_type sVar2;
  reference pvVar3;
  const_reference pvVar4;
  ostream *poVar5;
  reference pvVar6;
  ulong in_RCX;
  EVP_PKEY_CTX *in_RDX;
  float *in_RSI;
  Recomposer<float> *in_RDI;
  byte in_R8B;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *in_R9;
  size_t n3;
  size_t n2_1;
  size_t n1_1;
  int i_4;
  size_t n2;
  size_t n1;
  int i_3;
  int i_2;
  size_t h;
  int i_1;
  int i;
  size_t stride;
  unsigned_long *d;
  const_iterator __end2;
  const_iterator __begin2;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *__range2;
  size_t num_elements;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *in_stack_fffffffffffffde8;
  undefined4 in_stack_fffffffffffffdf0;
  undefined4 in_stack_fffffffffffffdf4;
  vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  *in_stack_fffffffffffffdf8;
  allocator_type *in_stack_fffffffffffffe00;
  size_type in_stack_fffffffffffffe08;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *in_stack_fffffffffffffe10;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *pvVar7;
  float *in_stack_fffffffffffffe18;
  float *dim1_stride;
  undefined4 in_stack_fffffffffffffe20;
  float in_stack_fffffffffffffe24;
  float in_stack_fffffffffffffe28;
  undefined4 in_stack_fffffffffffffe2c;
  float fVar8;
  Recomposer<float> *in_stack_fffffffffffffe30;
  value_type n1_00;
  float *in_stack_fffffffffffffe38;
  Recomposer<float> *in_stack_fffffffffffffe40;
  Recomposer<float> *this_01;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *in_stack_fffffffffffffe48;
  float *in_stack_fffffffffffffe50;
  undefined4 in_stack_fffffffffffffe58;
  float in_stack_fffffffffffffe5c;
  float in_stack_fffffffffffffe60;
  undefined4 in_stack_fffffffffffffe64;
  Recomposer<float> *in_stack_fffffffffffffe68;
  undefined4 in_stack_fffffffffffffe80;
  undefined4 in_stack_fffffffffffffe84;
  int local_d4;
  int local_c0;
  int local_bc;
  ulong local_b8;
  int local_98;
  int local_94;
  value_type local_90;
  size_t in_stack_ffffffffffffff88;
  float in_stack_ffffffffffffff94;
  size_t in_stack_ffffffffffffff98;
  size_t in_stack_ffffffffffffffa0;
  float *in_stack_ffffffffffffffa8;
  __normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  local_48 [2];
  long local_38;
  byte local_21;
  ulong local_20;
  EVP_PKEY_CTX *local_18;
  
  local_21 = in_R8B & 1;
  in_RDI->data = in_RSI;
  local_38 = 1;
  local_20 = in_RCX;
  local_18 = in_RDX;
  local_48[0]._M_current =
       (unsigned_long *)
       std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin(in_stack_fffffffffffffde8);
  this_00 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end
                      (in_stack_fffffffffffffde8);
  while (bVar1 = __gnu_cxx::operator!=
                           ((__normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                             *)CONCAT44(in_stack_fffffffffffffdf4,in_stack_fffffffffffffdf0),
                            (__normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                             *)in_stack_fffffffffffffde8), bVar1) {
    in_stack_ffffffffffffffa8 =
         (float *)__gnu_cxx::
                  __normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                  ::operator*(local_48);
    local_38 = *(unsigned_long *)in_stack_ffffffffffffffa8 * local_38;
    __gnu_cxx::
    __normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
    ::operator++(local_48);
  }
  sVar2 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size(in_R9);
  if (sVar2 == 0) {
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_18);
    std::allocator<unsigned_long>::allocator((allocator<unsigned_long> *)0x1132b1);
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
              (in_stack_fffffffffffffe10,in_stack_fffffffffffffe08,in_stack_fffffffffffffe00);
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator=
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)in_stack_fffffffffffffe00,
               (vector<unsigned_long,_std::allocator<unsigned_long>_> *)in_stack_fffffffffffffdf8);
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)in_stack_fffffffffffffe00);
    std::allocator<unsigned_long>::~allocator((allocator<unsigned_long> *)0x1132ff);
    local_90 = 1;
    sVar2 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size
                      ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_18);
    local_94 = (int)sVar2;
    while (local_94 = local_94 + -1, -1 < local_94) {
      pvVar3 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                         (in_R9,(long)local_94);
      *pvVar3 = local_90;
      pvVar4 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                         ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_18,
                          (long)local_94);
      local_90 = *pvVar4 * local_90;
    }
    for (local_98 = 0;
        sVar2 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size
                          ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_18),
        (ulong)(long)local_98 < sVar2; local_98 = local_98 + 1) {
      pvVar3 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                         (in_R9,(long)local_98);
      poVar5 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,*pvVar3);
      std::operator<<(poVar5," ");
    }
    std::ostream::operator<<((ostream *)&std::cout,std::endl<char,std::char_traits<char>>);
  }
  in_RDI->data_buffer_size = local_38 << 2;
  init(in_RDI,local_18);
  bVar1 = std::
          vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
          ::empty((vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                   *)in_stack_fffffffffffffe00);
  if (bVar1) {
    init_levels((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                CONCAT44(in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58),
                (size_t)in_stack_fffffffffffffe50);
    std::
    vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
    ::operator=((vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                 *)in_stack_fffffffffffffe00,in_stack_fffffffffffffdf8);
    std::
    vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
    ::~vector((vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
               *)in_stack_fffffffffffffe00);
  }
  local_b8 = (ulong)(1 << ((char)local_20 - 1U & 0x1f));
  sVar2 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size
                    ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_18);
  if (sVar2 == 1) {
    for (local_bc = 0; (ulong)(long)local_bc < local_20; local_bc = local_bc + 1) {
      if ((local_21 & 1) == 0) {
        pvVar6 = std::
                 vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                 ::operator[](&in_RDI->level_dims,(long)(local_bc + 1));
        std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[](pvVar6,0);
        recompose_level_1D((Recomposer<float> *)
                           CONCAT44(in_stack_fffffffffffffe24,in_stack_fffffffffffffe20),
                           in_stack_fffffffffffffe18,(size_t)in_stack_fffffffffffffe10,
                           (float)(in_stack_fffffffffffffe08 >> 0x20),
                           SUB81(in_stack_fffffffffffffe08 >> 0x18,0));
      }
      else {
        pvVar6 = std::
                 vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                 ::operator[](&in_RDI->level_dims,(long)(local_bc + 1));
        std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[](pvVar6,0);
        recompose_level_1D_hierarhical_basis
                  ((Recomposer<float> *)
                   CONCAT44(in_stack_fffffffffffffe24,in_stack_fffffffffffffe20),
                   in_stack_fffffffffffffe18,(size_t)in_stack_fffffffffffffe10,
                   (float)(in_stack_fffffffffffffe08 >> 0x20),
                   SUB81(in_stack_fffffffffffffe08 >> 0x18,0));
      }
    }
  }
  else {
    sVar2 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size
                      ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_18);
    if (sVar2 == 2) {
      for (local_c0 = 0; (ulong)(long)local_c0 < local_20; local_c0 = local_c0 + 1) {
        pvVar6 = std::
                 vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                 ::operator[](&in_RDI->level_dims,(long)(local_c0 + 1));
        std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[](pvVar6,0);
        pvVar6 = std::
                 vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                 ::operator[](&in_RDI->level_dims,(long)(local_c0 + 1));
        std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[](pvVar6,1);
        if ((local_21 & 1) == 0) {
          std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[](in_R9,0);
          recompose_level_2D((Recomposer<float> *)this_00._M_current,in_stack_ffffffffffffffa8,
                             in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,
                             in_stack_ffffffffffffff94,in_stack_ffffffffffffff88);
        }
        else {
          std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[](in_R9,0);
          recompose_level_2D_hierarhical_basis
                    (in_stack_fffffffffffffe30,
                     (float *)CONCAT44(in_stack_fffffffffffffe2c,in_stack_fffffffffffffe28),
                     CONCAT44(in_stack_fffffffffffffe24,in_stack_fffffffffffffe20),
                     (size_t)in_stack_fffffffffffffe18,
                     (float)((ulong)in_stack_fffffffffffffe10 >> 0x20),in_stack_fffffffffffffe08);
        }
      }
    }
    else {
      sVar2 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size
                        ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_18);
      if (sVar2 == 3) {
        for (local_d4 = 0; (ulong)(long)local_d4 < local_20; local_d4 = local_d4 + 1) {
          pvVar6 = std::
                   vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                   ::operator[](&in_RDI->level_dims,(long)(local_d4 + 1));
          pvVar3 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[](pvVar6,0);
          this_01 = (Recomposer<float> *)*pvVar3;
          pvVar6 = std::
                   vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                   ::operator[](&in_RDI->level_dims,(long)(local_d4 + 1));
          pvVar3 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[](pvVar6,1);
          pvVar7 = (vector<unsigned_long,_std::allocator<unsigned_long>_> *)*pvVar3;
          pvVar6 = std::
                   vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                   ::operator[](&in_RDI->level_dims,(long)(local_d4 + 1));
          pvVar3 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[](pvVar6,2);
          dim1_stride = (float *)*pvVar3;
          if ((local_21 & 1) == 0) {
            in_stack_fffffffffffffe24 = (float)(long)local_b8;
            in_stack_fffffffffffffe28 = (float)local_b8;
            std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[](in_R9,0);
            std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[](in_R9,1);
            recompose_level_3D(in_stack_fffffffffffffe68,
                               (float *)CONCAT44(in_stack_fffffffffffffe64,in_stack_fffffffffffffe60
                                                ),
                               CONCAT44(in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58),
                               (size_t)in_stack_fffffffffffffe50,(size_t)in_stack_fffffffffffffe48,
                               (float)((ulong)in_stack_fffffffffffffe40 >> 0x20),
                               (size_t)in_stack_fffffffffffffe38,
                               CONCAT44(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80));
          }
          else {
            in_stack_fffffffffffffe38 = in_RDI->data;
            in_stack_fffffffffffffe5c = (float)(long)local_b8;
            fVar8 = (float)local_b8;
            in_stack_fffffffffffffe60 = fVar8;
            pvVar3 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[](in_R9,0)
            ;
            n1_00 = *pvVar3;
            std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[](in_R9,1);
            in_stack_fffffffffffffe48 = pvVar7;
            in_stack_fffffffffffffe50 = dim1_stride;
            recompose_level_3D_hierarchical_basis
                      (this_01,in_stack_fffffffffffffe38,n1_00,
                       CONCAT44(fVar8,in_stack_fffffffffffffe28),
                       CONCAT44(in_stack_fffffffffffffe24,in_stack_fffffffffffffe20),
                       (float)((ulong)in_stack_fffffffffffffe18 >> 0x20),
                       (size_t)in_stack_fffffffffffffe10,(size_t)dim1_stride);
            pvVar7 = in_stack_fffffffffffffe10;
            dim1_stride = in_stack_fffffffffffffe18;
            in_stack_fffffffffffffe40 = this_01;
          }
          local_b8 = local_b8 >> 1;
          in_stack_fffffffffffffe10 = pvVar7;
          in_stack_fffffffffffffe18 = dim1_stride;
        }
      }
    }
  }
  return;
}

Assistant:

void recompose(T * data_, const vector<size_t>& dims, size_t target_level, bool hierarchical=false, vector<size_t> strides=vector<size_t>()){
		data = data_;
		size_t num_elements = 1;
		for(const auto& d:dims){
			num_elements *= d;
		}
		if(strides.size() == 0){
			strides = vector<size_t>(dims.size());
			size_t stride = 1;
			for(int i=dims.size()-1; i>=0; i--){
				strides[i] = stride;
				stride *= dims[i];
			}
			for(int i=0; i<dims.size(); i++){
				cout << strides[i] << " ";
			}
			cout << endl;
		}
		data_buffer_size = num_elements * sizeof(T);
		init(dims);
        if(level_dims.empty()){
            level_dims = init_levels(dims, target_level);
        }
		size_t h = 1 << (target_level - 1);
		if(dims.size() == 1){
			for(int i=0; i<target_level; i++){
				hierarchical ? recompose_level_1D_hierarhical_basis(data, level_dims[i+1][0], h) : recompose_level_1D(data, level_dims[i+1][0], h);
				h >>= 1;
			}
		}
		else if(dims.size() == 2){
			for(int i=0; i<target_level; i++){
				size_t n1 = level_dims[i+1][0];
				size_t n2 = level_dims[i+1][1];
				hierarchical ? recompose_level_2D_hierarhical_basis(data, n1, n2, (T)h, strides[0]) : recompose_level_2D(data, n1, n2, (T)h, strides[0]);
				h >>= 1;
			}
		}
        else if(dims.size() == 3){
            for(int i=0; i<target_level; i++){
                size_t n1 = level_dims[i+1][0];
                size_t n2 = level_dims[i+1][1];
                size_t n3 = level_dims[i+1][2];
                hierarchical ? recompose_level_3D_hierarchical_basis(data, n1, n2, n3, (T)h, strides[0], strides[1]) : recompose_level_3D(data, n1, n2, n3, (T)h, strides[0], strides[1]);
                h >>= 1;
            }
        }
	}